

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_floating_abi_cxx11_
          (result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  const_iterator rollback;
  bool bVar1;
  value_type *pvVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  detail *ctx;
  pair<double,_toml::detail::region> *this_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_372;
  allocator<char> local_371;
  string str;
  undefined1 local_350 [32];
  floating v;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  result<toml::detail::region,_toml::detail::none_t> token;
  undefined1 local_298 [112];
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  undefined1 local_1f0 [8];
  region local_1e8;
  istringstream iss;
  undefined7 uStack_19f;
  region local_198 [5];
  
  rollback._M_current = *(char **)(this + 0x40);
  ctx = this;
  either<$e07b6a6f$>::invoke(&token,(location *)this);
  if (token.is_ok_ != true) {
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&token,(EVP_PKEY_CTX *)ctx);
    location::reset((location *)this,rollback);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"toml::parse_floating: ",(allocator<char> *)&local_228);
    source_location::source_location((source_location *)local_298,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[30],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&iss,(source_location *)local_298,(char (*) [30])"the next token is not a float");
    __l._M_len = 1;
    __l._M_array = (iterator)&iss;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_350,__l,(allocator_type *)&local_300);
    local_328._0_8_ = (pointer)0x0;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_allocated_capacity = 0;
    format_underline((string *)local_1f0,&str,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_328,false);
    token._0_8_ = (long)&token.field_1 + 8;
    if (local_1f0 == (undefined1  [8])&local_1e8.source_) {
      token.field_1.succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           local_1e8.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    else {
      token._0_8_ = local_1f0;
    }
    token.field_1.succ.value.super_region_base._vptr_region_base =
         (region_base)(region_base)local_1e8.super_region_base._vptr_region_base;
    local_1e8.super_region_base._vptr_region_base = (_func_int **)0x0;
    local_1e8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_1_ = '\0';
    local_1f0 = (undefined1  [8])&local_1e8.source_;
    result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(failure_type *)&token);
    std::__cxx11::string::~string((string *)&token);
    std::__cxx11::string::~string((string *)local_1f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_350);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&iss);
    source_location::~source_location((source_location *)local_298);
    std::__cxx11::string::~string((string *)&str);
    return __return_storage_ptr__;
  }
  pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
  region::str_abi_cxx11_(&str,pvVar2);
  bVar1 = std::operator==(&str,"inf");
  if ((bVar1) || (bVar1 = std::operator==(&str,"+inf"), bVar1)) {
    pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
    local_298._0_8_ = INFINITY;
    region::region((region *)(local_298 + 8),pvVar2);
  }
  else {
    bVar1 = std::operator==(&str,"-inf");
    if (bVar1) {
      pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
      local_298._0_8_ = -INFINITY;
      region::region((region *)(local_298 + 8),pvVar2);
    }
    else {
      bVar1 = std::operator==(&str,"nan");
      if ((bVar1) || (bVar1 = std::operator==(&str,"+nan"), bVar1)) {
        pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
        local_298._0_8_ = NAN;
        region::region((region *)(local_298 + 8),pvVar2);
      }
      else {
        bVar1 = std::operator==(&str,"-nan");
        if (!bVar1) {
          iss = (istringstream)0x5f;
          _Var3 = std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )str._M_dataplus._M_p,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(str._M_dataplus._M_p + str._M_string_length),
                             (_Iter_equals_val<const_char>)&iss);
          std::__cxx11::string::erase
                    (&str,_Var3._M_current,str._M_dataplus._M_p + str._M_string_length);
          std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&str,_S_in);
          v = 0.0;
          std::istream::_M_extract<double>((double *)&iss);
          if ((*(byte *)((long)&local_198[0].source_name_._M_dataplus._M_p +
                        *(long *)(CONCAT71(uStack_19f,iss) + -0x18)) & 5) == 0) {
            pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
            local_1f0 = (undefined1  [8])v;
            region::region(&local_1e8,pvVar2);
            this_00 = (pair<double,_toml::detail::region> *)local_298;
            std::pair<double,_toml::detail::region>::pair
                      (this_00,(pair<double,_toml::detail::region> *)local_1f0);
            result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::result(__return_storage_ptr__,(success_type *)this_00);
            region::~region((region *)(local_298 + 8));
            region::~region(&local_1e8);
          }
          else {
            location::reset((location *)this,rollback);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228,"toml::parse_floating:",&local_371);
            source_location::source_location((source_location *)local_1f0,(location *)this);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[13],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_298,(source_location *)local_1f0,(char (*) [13])"out of range");
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)local_298;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector(&local_300,__l_00,&local_372);
            local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline((string *)local_328,&local_228,&local_300,&local_208,false);
            local_350._0_8_ = local_350 + 0x10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._0_8_ == &local_318) {
              local_350._24_8_ = local_318._8_8_;
            }
            else {
              local_350._0_8_ = local_328._0_8_;
            }
            local_350._8_8_ = local_328._8_8_;
            local_328._8_8_ = (pointer)0x0;
            local_318._M_allocated_capacity = local_318._M_allocated_capacity & 0xffffffffffffff00;
            this_00 = (pair<double,_toml::detail::region> *)local_350;
            local_328._0_8_ = &local_318;
            result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::result(__return_storage_ptr__,(failure_type *)local_350);
            std::__cxx11::string::~string((string *)local_350);
            std::__cxx11::string::~string((string *)local_328);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_208);
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_300);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_298);
            source_location::~source_location((source_location *)local_1f0);
            std::__cxx11::string::~string((string *)&local_228);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
          goto LAB_001239c5;
        }
        pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
        local_298._0_8_ = -NAN;
        region::region((region *)(local_298 + 8),pvVar2);
      }
    }
  }
  this_00 = (pair<double,_toml::detail::region> *)&iss;
  std::pair<double,_toml::detail::region>::pair
            (this_00,(pair<double,_toml::detail::region> *)local_298);
  result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::result(__return_storage_ptr__,(success_type *)this_00);
  region::~region(local_198);
  region::~region((region *)(local_298 + 8));
LAB_001239c5:
  std::__cxx11::string::~string((string *)&str);
  result<toml::detail::region,_toml::detail::none_t>::cleanup(&token,(EVP_PKEY_CTX *)this_00);
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<floating, region>, std::string>
parse_floating(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_float::invoke(loc))
    {
        auto str = token.unwrap().str();
        if(str == "inf" || str == "+inf")
        {
            if(std::numeric_limits<floating>::has_infinity)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::infinity(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: inf value found"
                    " but the current environment does not support inf. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "-inf")
        {
            if(std::numeric_limits<floating>::has_infinity)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::infinity(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: inf value found"
                    " but the current environment does not support inf. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "nan" || str == "+nan")
        {
            if(std::numeric_limits<floating>::has_quiet_NaN)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::quiet_NaN(), token.unwrap()));
            }
            else if(std::numeric_limits<floating>::has_signaling_NaN)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::signaling_NaN(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: NaN value found"
                    " but the current environment does not support NaN. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "-nan")
        {
            if(std::numeric_limits<floating>::has_quiet_NaN)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::quiet_NaN(), token.unwrap()));
            }
            else if(std::numeric_limits<floating>::has_signaling_NaN)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::signaling_NaN(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: NaN value found"
                    " but the current environment does not support NaN. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());
        std::istringstream iss(str);
        floating v(0.0);
        iss >> v;
        if(iss.fail())
        {
            // see parse_octal_integer for detail of this error message.
            loc.reset(first);
            return err(format_underline("toml::parse_floating:",
                       {{source_location(loc), "out of range"}}));
        }
        return ok(std::make_pair(v, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("toml::parse_floating: ",
               {{source_location(loc), "the next token is not a float"}}));
}